

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::~TestResultParser(TestResultParser *this)

{
  TestResultParser *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_curNumValue);
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::~vector(&this->m_itemStack);
  xml::Parser::~Parser(&this->m_xmlParser);
  return;
}

Assistant:

TestResultParser::~TestResultParser (void)
{
}